

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O3

size_t segment(converter_desc *converter,ucs4_t **inbuf,size_t *inbuf_left,ucs4_t **outbuf,
              size_t *outbuf_left)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ucs4_t *word;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t local_38;
  
  word = *inbuf;
  sVar1 = *inbuf_left;
  if (*word == 0) {
    uVar6 = 0;
    uVar5 = 0;
    sVar2 = sVar1;
LAB_001039ec:
    if ((sVar2 != 0) && (*outbuf_left != 0)) {
      sVar2 = sp_seg(converter,inbuf,inbuf_left,outbuf,outbuf_left,uVar5 - uVar6);
      if (sVar2 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      if (sVar2 == 0) {
LAB_00103a22:
        if (sVar1 - *inbuf_left != 0) {
          return sVar1 - *inbuf_left;
        }
        errnum = CONVERTER_ERROR_OUTBUF;
        return 0xffffffffffffffff;
      }
    }
  }
  else if (sVar1 != 0) {
    uVar6 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      if (*outbuf_left == 0) break;
      if ((uVar4 != 0) && (uVar4 == uVar5)) {
        sVar2 = sp_seg(converter,inbuf,inbuf_left,outbuf,outbuf_left,uVar4 - uVar6);
        if (sVar2 == 0xffffffffffffffff) {
          return 0xffffffffffffffff;
        }
        uVar6 = uVar4;
        if (sVar2 == 0) goto LAB_00103a22;
      }
      dictionary_group_match_longest(converter->current_dictionary_group,word,0,&local_38);
      uVar3 = local_38 + uVar4 + (ulong)(local_38 == 0);
      if (uVar5 < uVar3) {
        uVar5 = uVar3;
      }
      sVar2 = *inbuf_left;
      if (word[1] == 0) goto LAB_001039ec;
      word = word + 1;
      uVar4 = uVar4 + 1;
    } while (sVar2 != 0);
  }
  if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY) {
    *outbuf = *outbuf + -1;
    *outbuf_left = *outbuf_left + 1;
  }
  return sVar1 - *inbuf_left;
}

Assistant:

static size_t segment(converter_desc * converter,
		ucs4_t ** inbuf, size_t * inbuf_left,
		ucs4_t ** outbuf, size_t * outbuf_left)
{
	/* 歧義分割最短路徑分詞 */
	size_t i, start, bound;
	const ucs4_t * inbuf_start = *inbuf;
	size_t inbuf_left_start = *inbuf_left;
	size_t sp_seg_length;
	
	bound = 0;
	
	for (i = start = 0; inbuf_start[i] && *inbuf_left > 0 && *outbuf_left > 0; i ++)
	{
		if (i != 0 && i == bound)
		{
			/* 對歧義部分進行最短路徑分詞 */
			sp_seg_length = sp_seg(converter, inbuf, inbuf_left, outbuf, outbuf_left, bound - start);
			if (sp_seg_length ==  (size_t) -1)
				return (size_t) -1;
			if (sp_seg_length == 0)
			{
				if (inbuf_left_start - *inbuf_left > 0)
					return inbuf_left_start - *inbuf_left;
				/* 空間不足 */
				errnum = CONVERTER_ERROR_OUTBUF;
				return (size_t) -1;
			}
			start = i;
		}
	
		size_t match_len;
		dictionary_group_match_longest(
				converter->current_dictionary_group,
				inbuf_start + i,
				0,
				&match_len
		);
		
		if (match_len == 0)
			match_len = 1;
		
		if (i + match_len > bound)
			bound = i + match_len;
	}
	
	if (*inbuf_left > 0 && *outbuf_left > 0)
	{
		sp_seg_length = sp_seg(converter, inbuf, inbuf_left, outbuf, outbuf_left, bound - start);
		if (sp_seg_length ==  (size_t) -1)
			return (size_t) -1;
		if (sp_seg_length == 0)
		{
			if (inbuf_left_start - *inbuf_left > 0)
				return inbuf_left_start - *inbuf_left;
			/* 空間不足 */
			errnum = CONVERTER_ERROR_OUTBUF;
			return (size_t) -1;
		}
	}

	if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
	{
		(*outbuf) --;
		(*outbuf_left) ++;
	}

	return inbuf_left_start - *inbuf_left;
}